

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator=(path *this,string_type *source)

{
  pointer pcVar1;
  format fmt;
  ulong uVar2;
  long *local_38 [2];
  long local_28 [2];
  
  fmt = (format)local_38;
  pcVar1 = (source->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_38,pcVar1,pcVar1 + source->_M_string_length);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  if (local_38[0] != local_28) {
    uVar2 = local_28[0] + 1;
    operator_delete(local_38[0],uVar2);
    fmt = (format)uVar2;
  }
  postprocess_path_with_format(this,fmt);
  return this;
}

Assistant:

GHC_INLINE path& path::operator=(path::string_type&& source)
{
    return assign(source);
}